

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL>_> *this)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined4 *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>
  *__tmp;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>,_std::allocator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_58;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  bVar1 = AtEnd(this);
  if (!bVar1) {
    puVar2 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
                         + 0x28))();
    puVar3 = (undefined8 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Head_base<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,_false>
                                   ._M_head_impl.impl_._M_t.
                                   super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<(anonymous_namespace)::gfIntervalParam>,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::gfIntervalParam>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::gfIntervalParam>_*,_std::default_delete<testing::internal::ParamIteratorInterface<(anonymous_namespace)::gfIntervalParam>_>_>
                                   .
                                   super__Head_base<0UL,_testing::internal::ParamIteratorInterface<(anonymous_namespace)::gfIntervalParam>_*,_false>
                         + 0x28))();
    puVar4 = (undefined4 *)
             (**(code **)(*(long *)(this->current_).
                                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<(anonymous_namespace)::gfIntervalParam>,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_rc_mode>_>
                                   .
                                   super__Head_base<2UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>
                                   ._M_head_impl.impl_._M_t + 0x28))();
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
    local_58._M_alloc = &__a2;
    p_Var5->_M_use_count = 1;
    p_Var5->_M_weak_count = 1;
    p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00ef1720;
    *(undefined4 *)&p_Var5[1]._vptr__Sp_counted_base = *puVar4;
    p_Var5[1]._M_weak_count = *(_Atomic_word *)(puVar3 + 1);
    *(undefined8 *)((long)&p_Var5[1]._vptr__Sp_counted_base + 4) = *puVar3;
    p_Var5[2]._vptr__Sp_counted_base = (_func_int **)*puVar2;
    local_58._M_ptr = (pointer)0x0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>,_std::allocator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_58);
    local_48 = 0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_alloc =
         (allocator<std::_Sp_counted_ptr_inplace<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>,_std::allocator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>_>,_(__gnu_cxx::_Lock_policy)2>_>
          *)(this->current_value_).
            super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
    local_58._M_ptr =
         (pointer)(this->current_value_).
                  super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    (this->current_value_).
    super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var5 + 1);
    (this->current_value_).
    super___shared_ptr<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::gfIntervalParam,_aom_rc_mode>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_ptr);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_40);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }